

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::number::impl::NumberStringBuilder::toTempUnicodeString
          (UnicodeString *__return_storage_ptr__,NumberStringBuilder *this)

{
  char16_t *pcVar1;
  ConstChar16Ptr local_20;
  NumberStringBuilder *local_18;
  NumberStringBuilder *this_local;
  
  local_18 = this;
  this_local = (NumberStringBuilder *)__return_storage_ptr__;
  pcVar1 = getCharPtr(this);
  ConstChar16Ptr::ConstChar16Ptr(&local_20,pcVar1 + this->fZero);
  UnicodeString::UnicodeString(__return_storage_ptr__,'\0',&local_20,this->fLength);
  ConstChar16Ptr::~ConstChar16Ptr(&local_20);
  return __return_storage_ptr__;
}

Assistant:

const UnicodeString NumberStringBuilder::toTempUnicodeString() const {
    // Readonly-alias constructor:
    return UnicodeString(FALSE, getCharPtr() + fZero, fLength);
}